

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzio.c
# Opt level: O2

void check_header(gz_stream *s)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  size_t sVar5;
  Byte *pBVar6;
  uint uVar7;
  long lVar8;
  bool bVar9;
  
  uVar2 = (s->stream).avail_in;
  if ((ulong)uVar2 < 2) {
    if (uVar2 != 0) {
      *s->inbuf = *(s->stream).next_in;
    }
    piVar4 = __errno_location();
    *piVar4 = 0;
    sVar5 = fread(s->inbuf + uVar2,1,0x4000L >> ((byte)uVar2 & 0x3f),(FILE *)s->file);
    if (((int)sVar5 == 0) && (iVar1 = ferror((FILE *)s->file), iVar1 != 0)) {
      s->z_err = -1;
    }
    uVar7 = (int)sVar5 + (s->stream).avail_in;
    (s->stream).avail_in = uVar7;
    pBVar6 = s->inbuf;
    (s->stream).next_in = pBVar6;
    lVar8 = 0xa8;
    uVar2 = uVar7;
    if (uVar7 < 2) goto LAB_004e482b;
  }
  else {
    pBVar6 = (s->stream).next_in;
  }
  uVar7 = 1;
  lVar8 = 0xa8;
  if ((*pBVar6 == '\x1f') && (pBVar6[1] == 0x8b)) {
    (s->stream).avail_in = uVar2 - 2;
    (s->stream).next_in = pBVar6 + 2;
    iVar1 = get_byte(s);
    uVar2 = get_byte(s);
    lVar8 = 0x70;
    if ((uVar2 & 0xe0) == 0 && iVar1 == 8) {
      iVar1 = 6;
      while (bVar9 = iVar1 != 0, iVar1 = iVar1 + -1, bVar9) {
        get_byte(s);
      }
      if ((uVar2 & 4) != 0) {
        iVar1 = get_byte(s);
        iVar3 = get_byte(s);
        iVar1 = iVar1 + iVar3 * 0x100 + 1;
        do {
          iVar1 = iVar1 + -1;
          if (iVar1 == 0) break;
          iVar3 = get_byte(s);
        } while (iVar3 != -1);
      }
      if ((uVar2 & 8) != 0) {
        do {
          iVar1 = get_byte(s);
        } while (iVar1 - 1U < 0xfffffffe);
      }
      if ((uVar2 & 0x10) != 0) {
        do {
          iVar1 = get_byte(s);
        } while (iVar1 - 1U < 0xfffffffe);
      }
      if ((uVar2 & 2) != 0) {
        iVar1 = 2;
        while (bVar9 = iVar1 != 0, iVar1 = iVar1 + -1, bVar9) {
          get_byte(s);
        }
      }
      uVar7 = (uint)(s->z_eof == 0) * 3 - 3;
    }
    else {
      uVar7 = 0xfffffffd;
    }
  }
LAB_004e482b:
  *(uint *)((long)&(s->stream).next_in + lVar8) = uVar7;
  return;
}

Assistant:

local void check_header(s)
    gz_stream *s;
{
    int method; /* method byte */
    int flags;  /* flags byte */
    uInt len;
    int c;

    /* Assure two bytes in the buffer so we can peek ahead -- handle case
       where first byte of header is at the end of the buffer after the last
       gzip segment */
    len = s->stream.avail_in;
    if (len < 2) {
        if (len) s->inbuf[0] = s->stream.next_in[0];
        errno = 0;
        len = (uInt)fread(s->inbuf + len, 1, Z_BUFSIZE >> len, s->file);
        if (len == 0 && ferror(s->file)) s->z_err = Z_ERRNO;
        s->stream.avail_in += len;
        s->stream.next_in = s->inbuf;
        if (s->stream.avail_in < 2) {
            s->transparent = s->stream.avail_in;
            return;
        }
    }

    /* Peek ahead to check the gzip magic header */
    if (s->stream.next_in[0] != gz_magic[0] ||
        s->stream.next_in[1] != gz_magic[1]) {
        s->transparent = 1;
        return;
    }
    s->stream.avail_in -= 2;
    s->stream.next_in += 2;

    /* Check the rest of the gzip header */
    method = get_byte(s);
    flags = get_byte(s);
    if (method != Z_DEFLATED || (flags & RESERVED) != 0) {
        s->z_err = Z_DATA_ERROR;
        return;
    }

    /* Discard time, xflags and OS code: */
    for (len = 0; len < 6; len++) (void)get_byte(s);

    if ((flags & EXTRA_FIELD) != 0) { /* skip the extra field */
        len  =  (uInt)get_byte(s);
        len += ((uInt)get_byte(s))<<8;
        /* len is garbage if EOF but the loop below will quit anyway */
        while (len-- != 0 && get_byte(s) != EOF) ;
    }
    if ((flags & ORIG_NAME) != 0) { /* skip the original file name */
        while ((c = get_byte(s)) != 0 && c != EOF) ;
    }
    if ((flags & COMMENT) != 0) {   /* skip the .gz file comment */
        while ((c = get_byte(s)) != 0 && c != EOF) ;
    }
    if ((flags & HEAD_CRC) != 0) {  /* skip the header crc */
        for (len = 0; len < 2; len++) (void)get_byte(s);
    }
    s->z_err = s->z_eof ? Z_DATA_ERROR : Z_OK;
}